

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,StringPiece input,MessageLite *msg,ParseFlags parse_flags)

{
  int iVar1;
  undefined4 extraout_var;
  MessageLite *msg_00;
  bool local_b1;
  undefined1 local_b0 [8];
  ParseContext ctx;
  char *ptr;
  ParseFlags parse_flags_local;
  MessageLite *msg_local;
  StringPiece input_local;
  
  msg_00 = (MessageLite *)input.length_;
  input_local.ptr_ = input.ptr_;
  msg_local = (MessageLite *)this;
  iVar1 = io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::stringpiece_internal::StringPiece&>
            ((ParseContext *)local_b0,iVar1,true,(char **)&ctx.data_.arena,(StringPiece *)&msg_local
            );
  iVar1 = (*msg_00->_vptr_MessageLite[10])(msg_00,ctx.data_.arena,local_b0);
  ctx.data_.arena = (Arena *)CONCAT44(extraout_var,iVar1);
  local_b1 = false;
  if (ctx.data_.arena != (Arena *)0x0) {
    local_b1 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_b0);
  }
  if (local_b1 == false) {
    input_local.length_._7_1_ = false;
  }
  else {
    input_local.length_._7_1_ =
         anon_unknown_13::CheckFieldPresence((ParseContext *)local_b0,msg_00,(ParseFlags)msg);
  }
  return input_local.length_._7_1_;
}

Assistant:

bool MergeFromImpl(StringPiece input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has an explicit limit set (length of string_view).
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}